

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schedule.hpp
# Opt level: O1

size_t __thiscall Common::analyzeMemory(Common *this,TaskHandle *head)

{
  pointer psVar1;
  long *plVar2;
  pointer pOVar3;
  element_type *peVar4;
  element_type *peVar5;
  shared_ptr<Operand> *operand;
  _Rb_tree_node_base *p_Var6;
  pointer psVar7;
  OperandUsage *usage;
  pointer pOVar8;
  element_type *peVar9;
  vector<std::shared_ptr<Operand>,_std::allocator<std::shared_ptr<Operand>_>_> *__range1;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  TaskHandle task;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  analyzeTopology(this,head);
  psVar1 = (this->operands).
           super__Vector_base<std::shared_ptr<Operand>,_std::allocator<std::shared_ptr<Operand>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (psVar7 = (this->operands).
                super__Vector_base<std::shared_ptr<Operand>,_std::allocator<std::shared_ptr<Operand>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar7 != psVar1; psVar7 = psVar7 + 1) {
    ((psVar7->super___shared_ptr<Operand,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->on_device = false;
  }
  uVar11 = 0;
  for (p_Var6 = (this->already_on)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var6 != &(this->already_on)._M_t._M_impl.super__Rb_tree_header;
      p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
    plVar2 = *(long **)(p_Var6 + 1);
    *(undefined1 *)(plVar2 + 4) = 1;
    uVar11 = uVar11 + *plVar2;
  }
  peVar9 = (head->super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_20._M_pi = (head->super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_20._M_pi)->_M_use_count = (local_20._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_20._M_pi)->_M_use_count = (local_20._M_pi)->_M_use_count + 1;
    }
  }
  if (peVar9 != (element_type *)0x0) {
    uVar12 = uVar11;
    do {
      for (pOVar8 = (peVar9->ins).super__Vector_base<OperandUsage,_std::allocator<OperandUsage>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pOVar8 != (peVar9->ins).super__Vector_base<OperandUsage,_std::allocator<OperandUsage>_>.
                    _M_impl.super__Vector_impl_data._M_finish; pOVar8 = pOVar8 + 1) {
        if (((pOVar8->operand).super___shared_ptr<Operand,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            on_device == false) {
          __assert_fail("usage.operand->on_device",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/LyricZhao[P]DLMO/schedule.hpp"
                        ,0x212,"size_t Common::analyzeMemory(TaskHandle &) const");
        }
      }
      pOVar3 = (peVar9->outs).super__Vector_base<OperandUsage,_std::allocator<OperandUsage>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      for (pOVar8 = (peVar9->outs).super__Vector_base<OperandUsage,_std::allocator<OperandUsage>_>.
                    _M_impl.super__Vector_impl_data._M_start; pOVar8 != pOVar3; pOVar8 = pOVar8 + 1)
      {
        peVar4 = (pOVar8->operand).super___shared_ptr<Operand,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (peVar4->on_device == false) {
          peVar4->on_device = true;
          uVar12 = uVar12 + peVar4->size;
        }
      }
      uVar10 = peVar9->workspace + uVar12;
      peVar9->execution_memory = uVar10;
      if (uVar10 < uVar11) {
        uVar10 = uVar11;
      }
      uVar11 = uVar10;
      psVar1 = (peVar9->to_dealloc_after).
               super__Vector_base<std::shared_ptr<Operand>,_std::allocator<std::shared_ptr<Operand>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (psVar7 = (peVar9->to_dealloc_after).
                    super__Vector_base<std::shared_ptr<Operand>,_std::allocator<std::shared_ptr<Operand>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; psVar7 != psVar1; psVar7 = psVar7 + 1
          ) {
        peVar4 = (psVar7->super___shared_ptr<Operand,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        peVar4->on_device = false;
        uVar12 = uVar12 - peVar4->size;
      }
      peVar5 = (peVar9->next).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&local_20,
                 &(peVar9->next).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      peVar9 = peVar5;
    } while (peVar5 != (element_type *)0x0);
  }
  if (local_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20._M_pi);
  }
  return uVar11;
}

Assistant:

size_t analyzeMemory(TaskHandle &head) const {
        // Analyze topology
        analyzeTopology(head);

        // Operands already on device
        size_t current_memory = 0;
        for (auto &operand: operands) {
            operand->on_device = false;
        }
        for (auto &operand: already_on) {
            operand->on_device = true;
            current_memory += operand->size;
        }
        size_t peak_memory = current_memory;

        // Loop all tasks
        LOOP(task, head) {
            for (auto &usage: task->ins) {
                assert(usage.operand->on_device);
            }
            for (auto &usage: task->outs) {
                if (not usage.operand->on_device) {
                    usage.operand->on_device = true;
                    current_memory += usage.operand->size;
                }
            }
            task->execution_memory = current_memory + task->workspace;
            peak_memory = std::max(peak_memory, task->execution_memory);

            for (auto &operand: task->to_dealloc_after) {
                operand->on_device = false;
                current_memory -= operand->size;
            }
        }
        return peak_memory;
    }